

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall WriterTest_WriteLongLong_Test::TestBody(WriterTest_WriteLongLong_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined8 in_stack_fffffffffffffe98;
  int line;
  char *in_stack_fffffffffffffea0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffea8;
  Type in_stack_fffffffffffffeac;
  Type type;
  AssertHelper *in_stack_fffffffffffffeb0;
  AnyWriteChecker *in_stack_fffffffffffffeb8;
  AssertionResult *this_02;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertionResult local_e8 [2];
  longlong local_c8;
  AssertionResult local_b8 [2];
  longlong local_98;
  AssertionResult local_88 [2];
  undefined8 local_68;
  AssertionResult local_58 [3];
  undefined8 local_28;
  AssertionResult local_18;
  
  line = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_28 = 0x38;
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             (longlong *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12a2d8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x12a335);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a38a);
  local_68 = 0x4e;
  (anonymous_namespace)::AnyWriteChecker::operator()
            (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             (unsigned_long_long *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12a425);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x12a482);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a4d7);
  local_98 = std::numeric_limits<long_long>::min();
  this_02 = local_88;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)this_02,(char *)in_stack_fffffffffffffeb0,
             (longlong *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12a573);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x12a5d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a625);
  local_c8 = std::numeric_limits<long_long>::max();
  this_01 = local_b8;
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)this_02,(char *)in_stack_fffffffffffffeb0,
             (longlong *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x12a6c1);
    line = (int)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_01->success_,line,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x12a71e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a773);
  std::numeric_limits<unsigned_long_long>::max();
  (anonymous_namespace)::AnyWriteChecker::operator()
            ((AnyWriteChecker *)this_02,(char *)in_stack_fffffffffffffeb0,
             (unsigned_long_long *)CONCAT44(type,in_stack_fffffffffffffea8));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12a80f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,&this_01->success_,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe90));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12a86c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12a8c1);
  return;
}

Assistant:

TEST(WriterTest, WriteLongLong) {
  CHECK_WRITE(56ll);
  CHECK_WRITE(78ull);
  CHECK_WRITE(std::numeric_limits<long long>::min());
  CHECK_WRITE(std::numeric_limits<long long>::max());
  CHECK_WRITE(std::numeric_limits<unsigned long long>::max());
}